

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::collate(Config *this,string *parameter)

{
  uint uVar1;
  long lVar2;
  iterator iVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  if (parameter->_M_string_length == 0) {
    peVar4 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3._M_current =
         *(pointer *)
          ((long)&(peVar4->collate).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + 8);
  }
  else {
    do {
      lVar2 = std::__cxx11::string::find((char)parameter,0x2c);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)parameter);
      if (local_68 == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"--collate: trailing comma","");
        usage(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      peVar4 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = QUtil::string_to_uint((char *)local_70);
      local_50._M_dataplus._M_p = (pointer)(ulong)uVar1;
      iVar3._M_current =
           *(pointer *)
            ((long)&(peVar4->collate).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&(peVar4->collate).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data + 0x10)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&peVar4->collate,iVar3,(unsigned_long *)&local_50);
      }
      else {
        *iVar3._M_current = (unsigned_long)local_50._M_dataplus._M_p;
        *(unsigned_long **)
         ((long)&(peVar4->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    } while (lVar2 != -1);
    peVar4 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3._M_current =
         *(pointer *)
          ((long)&(peVar4->collate).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + 8);
    if ((peVar4->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != iVar3._M_current) {
      return this;
    }
  }
  local_70 = (long *)0x1;
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&(peVar4->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data + 0x10)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&peVar4->collate,iVar3,(unsigned_long *)&local_70);
  }
  else {
    *iVar3._M_current = 1;
    *(unsigned_long **)
     ((long)&(peVar4->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::collate(std::string const& parameter)
{
    if (parameter.empty()) {
        o.m->collate.push_back(1);
        return this;
    }
    size_t pos = 0;
    // Parse a,b,c
    while (true) {
        auto end = parameter.find(',', pos);
        auto n = parameter.substr(pos, end);
        if (n.empty()) {
            usage("--collate: trailing comma");
        }
        o.m->collate.push_back(QIntC::to_size(QUtil::string_to_uint(n.c_str())));
        if (end == std::string::npos) {
            break;
        }
        pos = end + 1;
    }
    if (o.m->collate.empty()) {
        o.m->collate.push_back(1);
    }
    return this;
}